

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  bool bVar1;
  Extension *pEVar2;
  const_reference piVar3;
  byte bVar4;
  uint in_ECX;
  uint uVar5;
  uint uVar6;
  uint extraout_EDX;
  int index;
  AllocatedData extraout_RDX;
  AllocatedData AVar7;
  int iVar8;
  int key;
  ExtensionSet *pEVar9;
  ExtensionSet *this_00;
  FieldDescriptor *in_R8;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar10;
  LogMessageFatal aLStack_70 [16];
  ulong uStack_60;
  ExtensionSet EStack_58;
  ExtensionSet EStack_30;
  undefined1 auStack_18 [16];
  
  pEVar9 = (ExtensionSet *)auStack_18;
  iVar8 = (int)auStack_18;
  AVar7._4_4_ = 0;
  AVar7._0_4_ = default_value;
  EStack_30.map_.flat = (KeyValue *)0x259c0e;
  pEVar2 = FindOrNull(this,number);
  if ((pEVar2 == (Extension *)0x0) || ((pEVar2->field_0xa & 2) != 0)) {
    return default_value;
  }
  if (pEVar2->is_repeated == false) {
    bVar4 = pEVar2->type;
    uVar5 = (uint)bVar4;
    in_ECX = (uint)bVar4;
    if ((byte)(bVar4 - 0x13) < 0xee) goto LAB_00259c4c;
    pEVar9 = (ExtensionSet *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4) == 8) {
      return (pEVar2->field_0).int32_t_value;
    }
  }
  else {
    EStack_30.map_.flat = (KeyValue *)0x259c4c;
    GetEnum();
LAB_00259c4c:
    uVar5 = in_ECX;
    EStack_30.map_.flat = (KeyValue *)0x259c54;
    GetEnum();
  }
  EStack_30.map_.flat = (KeyValue *)GetRefEnum;
  GetEnum();
  this_00 = &EStack_30;
  key = (int)&EStack_30;
  EStack_30.map_ = AVar7;
  EStack_58.map_.flat = (KeyValue *)FindOrNull(pEVar9,iVar8);
  AVar7 = extraout_RDX;
  if ((EStack_58.map_.flat == (KeyValue *)0x0) ||
     (AVar7 = extraout_RDX, (((EStack_58.map_.flat)->second).field_0.uint64_t_value & 0x20000) != 0)
     ) {
LAB_00259c98:
    return AVar7._0_4_;
  }
  if (*(bool *)((long)&((EStack_58.map_.flat)->second).field_0 + 1) == false) {
    bVar1 = ((EStack_58.map_.flat)->second).field_0.bool_value;
    uVar6 = (uint)bVar1;
    uVar5 = (uint)bVar1;
    if ((byte)(bVar1 - 0x13U) < 0xee) goto LAB_00259ca9;
    this_00 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4);
    AVar7.flat = EStack_58.map_.flat;
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 8)
    goto LAB_00259c98;
  }
  else {
    GetRefEnum();
LAB_00259ca9:
    uVar6 = uVar5;
    GetRefEnum();
    EStack_58.map_ = extraout_RDX;
  }
  GetRefEnum();
  pEVar9 = &EStack_58;
  iVar8 = (int)&EStack_58;
  uStack_60 = 0x259cd0;
  pVar10 = Insert(this_00,key);
  pEVar2 = pVar10.first;
  pEVar2->descriptor = in_R8;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar2->is_repeated != false) goto LAB_00259d43;
    if ((byte)(pEVar2->type - 0x13) < 0xee) goto LAB_00259d53;
    pEVar9 = (ExtensionSet *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4) == 8) {
      bVar4 = pEVar2->field_0xa;
      goto LAB_00259d29;
    }
  }
  else {
    pEVar2->type = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      uStack_60 = 0x259d43;
      SetEnum(&EStack_58);
LAB_00259d43:
      uStack_60 = 0x259d4b;
      SetEnum(&EStack_58);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)(extraout_EDX & 0xff) * 4) ==
             8) {
      pEVar2->is_repeated = false;
      bVar4 = pEVar2->field_0xa & 0xfe;
LAB_00259d29:
      pEVar2->field_0xa = bVar4 & 0xfd;
      (pEVar2->field_0).uint32_t_value = uVar6;
      return (int)pVar10.first;
    }
    uStack_60 = 0x259d53;
    SetEnum();
LAB_00259d53:
    uStack_60 = 0x259d5b;
    SetEnum(&EStack_58);
  }
  uStack_60 = 0x259d63;
  SetEnum();
  uStack_60 = (ulong)uVar6;
  pEVar2 = FindOrNull(pEVar9,iVar8);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_70,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1f8,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_70,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_00259df9;
  }
  if (pEVar2->is_repeated == false) {
    GetRepeatedEnum();
LAB_00259de9:
    GetRepeatedEnum();
  }
  else {
    if ((byte)(pEVar2->type - 0x13) < 0xee) goto LAB_00259de9;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4) == 8) {
      piVar3 = RepeatedField<int>::Get((RepeatedField<int> *)pEVar2->field_0,index);
      return *piVar3;
    }
  }
  GetRepeatedEnum();
LAB_00259df9:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_70);
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}